

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O1

void __thiscall Post::post_with_body::test_method(post_with_body *this)

{
  int iVar1;
  RequestDsl *pRVar2;
  Request *pRVar3;
  bool bVar4;
  char local_568 [8];
  char text [392];
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  undefined1 local_3b8 [8];
  Request result;
  Request should;
  undefined8 *local_2a8;
  string *psStack_2a0;
  long *local_298;
  char *pcStack_290;
  long local_288 [3];
  vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  vStack_270;
  void *local_258;
  undefined1 uStack_250;
  undefined7 uStack_24f;
  undefined1 local_248;
  undefined7 uStack_247;
  undefined1 uStack_240;
  undefined7 uStack_23f;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  memcpy(local_568,
         "POST /uri.cgi HTTP/1.1\r\nFrom: user@example.com\r\nUser-Agent: Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0\r\nAccept: text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8\r\nAccept-Language: en-US,en;q=0.5\r\nAccept-Encoding: gzip, deflate\r\nContent-Type: application/x-www-form-urlencoded\r\nContent-Length: 31\r\nHost: 127.0.0.1\r\n\r\narg1=test;arg1=%20%21;arg3=test"
         ,0x188);
  PostFixture::parse((Request *)local_3b8,(PostFixture *)this,local_568,0x188);
  local_298 = local_288;
  psStack_2a0 = (string *)0x0;
  local_288[1] = 0;
  uStack_23f = 0;
  local_258 = (void *)0x0;
  uStack_250 = 0;
  vStack_270.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_270.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288[2] = 0;
  vStack_270.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  should._120_8_ = &local_2a8;
  local_2a8 = (undefined8 *)0x0;
  pcStack_290 = (char *)0x0;
  local_288[0] = 0;
  uStack_24f = 0;
  local_248 = 0;
  uStack_247 = 0;
  uStack_240 = 0;
  std::__cxx11::string::_M_replace((ulong)&should.keepAlive,0,(char *)0x0,0x10b156);
  std::__cxx11::string::_M_replace((ulong)&local_298,0,pcStack_290,0x10b15b);
  local_288[2] = 0x100000001;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"From","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"user@example.com","");
  pRVar2 = RequestDsl::header((RequestDsl *)&should.keepAlive,&local_b0,&local_90);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"User-Agent","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0","");
  pRVar2 = RequestDsl::header(pRVar2,&local_70,&local_50);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Accept","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8",
             "");
  pRVar2 = RequestDsl::header(pRVar2,&local_d0,&local_130);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Accept-Language","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"en-US,en;q=0.5","");
  pRVar2 = RequestDsl::header(pRVar2,&local_110,&local_f0);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Accept-Encoding","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"gzip, deflate","");
  pRVar2 = RequestDsl::header(pRVar2,&local_1b0,&local_190);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Content-Type","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"application/x-www-form-urlencoded","");
  pRVar2 = RequestDsl::header(pRVar2,&local_170,&local_150);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Content-Length","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"31","");
  pRVar2 = RequestDsl::header(pRVar2,&local_230,&local_210);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Host","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"127.0.0.1","");
  pRVar2 = RequestDsl::header(pRVar2,&local_1f0,&local_1d0);
  pRVar3 = &RequestDsl::content<32ul>(pRVar2,(char (*) [32])"arg1=test;arg1=%20%21;arg3=test")->
            request;
  pRVar3->keepAlive = true;
  httpparser::Request::Request((Request *)&result.keepAlive,pRVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != (void *)0x0) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) - (long)local_258);
  }
  std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
  ~vector(&vStack_270);
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if ((undefined8 **)should._120_8_ != &local_2a8) {
    operator_delete((void *)should._120_8_,(long)local_2a8 + 1);
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_3d0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d8,0x3e);
  local_90._M_string_length._0_1_ = 0;
  local_90._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0010ece0;
  local_90.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_90.field_2._8_8_ = (long)"\n" + 1;
  httpparser::Request::inspect_abi_cxx11_(&local_70,(Request *)local_3b8);
  httpparser::Request::inspect_abi_cxx11_(&local_50,(Request *)&result.keepAlive);
  if (local_70._M_string_length == local_50._M_string_length) {
    if (local_70._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = bcmp(local_70._M_dataplus._M_p,local_50._M_dataplus._M_p,local_70._M_string_length);
      bVar4 = iVar1 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  local_d0._M_dataplus._M_p._0_1_ = bVar4;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_allocated_capacity = 0;
  local_130._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_130._M_string_length = 0x10b146;
  should._120_8_ = &PTR__lazy_ostream_0010ed58;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  psStack_2a0 = &local_110;
  local_b0._M_string_length._0_1_ = 0;
  local_b0._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0010ed58;
  local_b0.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_b0.field_2._8_8_ = &local_f0;
  local_110._M_dataplus._M_p = (pointer)&local_70;
  local_f0._M_dataplus._M_p = (pointer)&local_50;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_90,&local_130,0x3e,1,2,2,"result.inspect()",&should.keepAlive,
             "should.inspect()",&local_b0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (should.headers.
      super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(should.headers.
                    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)should.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)should.headers.
                          super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
  ~vector((vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
           *)&should.versionMajor);
  if ((size_type *)should.method.field_2._8_8_ != &should.uri._M_string_length) {
    operator_delete((void *)should.method.field_2._8_8_,should.uri._M_string_length + 1);
  }
  if ((size_type *)result._120_8_ != &should.method._M_string_length) {
    operator_delete((void *)result._120_8_,should.method._M_string_length + 1);
  }
  if (result.headers.
      super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(result.headers.
                    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)result.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)result.headers.
                          super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
  ~vector((vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
           *)&result.versionMajor);
  if ((size_type *)result.method.field_2._8_8_ != &result.uri._M_string_length) {
    operator_delete((void *)result.method.field_2._8_8_,result.uri._M_string_length + 1);
  }
  if (local_3b8 != (undefined1  [8])&result.method._M_string_length) {
    operator_delete((void *)local_3b8,result.method._M_string_length + 1);
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(post_with_body, PostFixture)
{
    const char text[] = "POST /uri.cgi HTTP/1.1\r\n"
                        "From: user@example.com\r\n"
                        "User-Agent: Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0\r\n"
                        "Accept: text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8\r\n"
                        "Accept-Language: en-US,en;q=0.5\r\n"
                        "Accept-Encoding: gzip, deflate\r\n"
                        "Content-Type: application/x-www-form-urlencoded\r\n"
                        "Content-Length: 31\r\n"
                        "Host: 127.0.0.1\r\n"
                        "\r\n"
                        "arg1=test;arg1=%20%21;arg3=test";
                       
    Request result = parse(text, sizeof(text));
    Request should = RequestDsl()
            .method("POST")
            .uri("/uri.cgi")
            .version(1, 1)
            .header("From", "user@example.com")
            .header("User-Agent", "Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0")
            .header("Accept", "text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8")
            .header("Accept-Language", "en-US,en;q=0.5")
            .header("Accept-Encoding", "gzip, deflate")
            .header("Content-Type", "application/x-www-form-urlencoded")
            .header("Content-Length", "31")
            .header("Host", "127.0.0.1")
            .content("arg1=test;arg1=%20%21;arg3=test")
            .keepAlive(true);
    
    BOOST_CHECK_EQUAL(result.inspect(), should.inspect());
}